

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

bool __thiscall QDataWidgetMapperPrivate::commit(QDataWidgetMapperPrivate *this,WidgetMapper *m)

{
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QWeakPointer<QObject>::isNull((QWeakPointer<QObject> *)m);
  bVar5 = true;
  if (!bVar3) {
    cVar4 = QPersistentModelIndex::isValid();
    if (cVar4 == '\0') {
      bVar5 = false;
    }
    else {
      local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&m->currentIndex);
      if ((m->property).d.size == 0) {
        pDVar2 = (m->widget).wp.d;
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          pQVar6 = (QObject *)0x0;
        }
        else {
          pQVar6 = (m->widget).wp.value;
        }
        (**(code **)(*(long *)this->delegate + 0x88))(this->delegate,pQVar6,this->model,&local_68);
      }
      else {
        pQVar1 = this->model;
        QObject::property((char *)&local_48);
        (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,&local_68,&local_48,2);
        ::QVariant::~QVariant(&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDataWidgetMapperPrivate::commit(const WidgetMapper &m)
{
    if (m.widget.isNull())
        return true; // just ignore

    if (!m.currentIndex.isValid())
        return false;

    // Create copy to avoid passing the widget mappers data
    QModelIndex idx = m.currentIndex;
    if (m.property.isEmpty())
        delegate->setModelData(m.widget, model, idx);
    else
        model->setData(idx, m.widget->property(m.property), Qt::EditRole);

    return true;
}